

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O0

int SSL_serialize_capabilities(SSL *ssl,CBB *out)

{
  bool bVar1;
  int iVar2;
  undefined1 local_50 [8];
  CBB seq;
  CBB *out_local;
  SSL *ssl_local;
  
  seq.u._24_8_ = out;
  iVar2 = CBB_add_asn1(out,(CBB *)local_50,0x20000010);
  if (((iVar2 == 0) || (bVar1 = bssl::serialize_features((CBB *)local_50), !bVar1)) ||
     (iVar2 = CBB_flush((CBB *)seq.u._24_8_), iVar2 == 0)) {
    ssl_local._4_4_ = 0;
  }
  else {
    ssl_local._4_4_ = 1;
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_serialize_capabilities(const SSL *ssl, CBB *out) {
  CBB seq;
  if (!CBB_add_asn1(out, &seq, CBS_ASN1_SEQUENCE) ||
      !serialize_features(&seq) ||  //
      !CBB_flush(out)) {
    return 0;
  }

  return 1;
}